

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_csupport.cpp
# Opt level: O0

int kmpc_get_affinity_mask_proc(int proc,void **mask)

{
  int iVar1;
  void **in_stack_00000058;
  int in_stack_00000060;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  iVar1 = __kmp_aux_get_affinity_mask_proc(in_stack_00000060,in_stack_00000058);
  return iVar1;
}

Assistant:

int kmpc_get_affinity_mask_proc(int proc, void **mask) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
  return -1;
#else
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  return __kmp_aux_get_affinity_mask_proc(proc, mask);
#endif
}